

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

int Llb_NonlinQuantify1(Llb_Mgr_t *p,Llb_Prt_t *pPart,int fSubset)

{
  DdNode *pDVar1;
  Llb_Var_t *pVar;
  int *piVar2;
  Llb_Prt_t *pLVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  DdNode *pDVar8;
  DdNode *n;
  uint *__ptr;
  Vec_Int_t *pVVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  int Length;
  int local_34;
  
  if (fSubset == 0) {
    pDVar8 = Llb_NonlinCreateCube1(p,pPart);
    Cudd_Ref(pDVar8);
    pDVar1 = pPart->bFunc;
    n = Cudd_bddExistAbstract(p->dd,pDVar1,pDVar8);
    pPart->bFunc = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    Cudd_RecursiveDeref(p->dd,pDVar8);
  }
  else {
    pDVar1 = pPart->bFunc;
    pDVar8 = Cudd_LargestCube(p->dd,pDVar1,&local_34);
    pPart->bFunc = pDVar8;
    Cudd_Ref(pDVar8);
    printf("Subsetting %3d : ",(ulong)(uint)pPart->iPart);
    uVar4 = Cudd_SupportSize(p->dd,pDVar1);
    uVar5 = Cudd_DagSize(pDVar1);
    printf("(Supp =%3d  Node =%5d) -> ",(ulong)uVar4,(ulong)uVar5);
    uVar4 = Cudd_SupportSize(p->dd,pPart->bFunc);
    uVar5 = Cudd_DagSize(pPart->bFunc);
    printf("(Supp =%3d  Node =%5d)\n",(ulong)uVar4,(ulong)uVar5);
    iVar6 = Cudd_DagSize(pDVar1);
    iVar7 = Cudd_DagSize(pPart->bFunc);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    if (iVar6 == iVar7) {
      return 1;
    }
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  iVar6 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  pVVar9 = pPart->vVars;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      pVar = p->pVars[pVVar9->pArray[lVar16]];
      pVVar9 = pVar->vParts;
      if (p->pSupp[pVar->iVar] == 0) {
        uVar4 = pVVar9->nSize;
        uVar12 = 0;
        bVar18 = 0 < (int)uVar4;
        if (0 < (int)uVar4) {
          bVar18 = true;
          if (*pVVar9->pArray != pPart->iPart) {
            uVar15 = 0;
            do {
              if ((ulong)uVar4 - 1 == uVar15) {
                bVar18 = false;
                uVar12 = (ulong)uVar4;
                goto LAB_00936b01;
              }
              uVar12 = uVar15 + 1;
              lVar17 = uVar15 + 1;
              uVar15 = uVar12;
            } while (pVVar9->pArray[lVar17] != pPart->iPart);
            bVar18 = uVar12 < uVar4;
          }
        }
LAB_00936b01:
        uVar5 = (uint)uVar12;
        if (uVar5 == uVar4) {
LAB_00936cd6:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                        ,0x136,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
        }
        if (!bVar18) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar14 = uVar4;
        if ((int)(uVar5 + 1) < (int)uVar4) {
          piVar2 = pVVar9->pArray;
          piVar13 = piVar2 + (uVar5 + 1);
          uVar12 = uVar12 & 0xffffffff;
          do {
            iVar7 = (int)uVar12;
            piVar2[uVar12] = *piVar13;
            uVar14 = pVVar9->nSize;
            piVar13 = piVar13 + 1;
            uVar12 = (ulong)(iVar7 + 1);
          } while (iVar7 + 2 < (int)uVar14);
        }
        pVVar9->nSize = uVar14 - 1;
        if (uVar5 == uVar4) goto LAB_00936cd6;
        pVar->nScore = pVar->nScore - pPart->nSize;
        if (pVVar9->nSize != 1) {
          if (pVVar9->nSize == 0) {
            Llb_NonlinRemoveVar(p,pVar);
          }
          goto LAB_00936aa9;
        }
        pLVar3 = p->pParts[*pVVar9->pArray];
        uVar4 = __ptr[1];
        lVar17 = (long)(int)uVar4;
        if (0 < lVar17) {
          lVar11 = 0;
          do {
            if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar11 * 8) == pLVar3) goto LAB_00936aa9;
            lVar11 = lVar11 + 1;
          } while (lVar17 != lVar11);
        }
        uVar5 = *__ptr;
        if (uVar4 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar14 = uVar5 * 2;
            if ((int)uVar14 <= (int)uVar5) goto LAB_00936c1a;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc((ulong)uVar5 << 4);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),(ulong)uVar5 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar10;
          *__ptr = uVar14;
        }
LAB_00936c1a:
        __ptr[1] = uVar4 + 1;
        *(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar17 * 8) = pLVar3;
      }
      else {
        if (pVVar9->nSize < 2) {
          __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                        ,0x130,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
        }
        pVar->nScore = pVar->nScore + (iVar6 - pPart->nSize);
      }
LAB_00936aa9:
      lVar16 = lVar16 + 1;
      pVVar9 = pPart->vVars;
    } while (lVar16 < pVVar9->nSize);
  }
  pPart->nSize = iVar6;
  pVVar9->nSize = 0;
  if (0 < p->nVars) {
    lVar16 = 0;
    do {
      if ((p->pSupp[lVar16] != 0) && (p->pVars2Q[lVar16] != 0)) {
        Vec_IntPush(pPart->vVars,(int)lVar16);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < p->nVars);
  }
  uVar4 = __ptr[1];
  if (0 < (long)(int)uVar4) {
    lVar16 = *(long *)(__ptr + 2);
    lVar17 = 0;
    do {
      Llb_NonlinQuantify1(p,*(Llb_Prt_t **)(lVar16 + lVar17 * 8),0);
      lVar17 = lVar17 + 1;
    } while ((int)uVar4 != lVar17);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return 0;
}

Assistant:

int Llb_NonlinQuantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart, int fSubset )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    if ( fSubset )
    {        
        int Length;
//        int nSuppSize = Cudd_SupportSize( p->dd, pPart->bFunc );
//        pPart->bFunc = Cudd_SubsetHeavyBranch( p->dd, bTemp = pPart->bFunc, nSuppSize, 3*pPart->nSize/4 );  Cudd_Ref( pPart->bFunc );
        pPart->bFunc = Cudd_LargestCube( p->dd, bTemp = pPart->bFunc, &Length );  Cudd_Ref( pPart->bFunc );

        printf( "Subsetting %3d : ", pPart->iPart );
        printf( "(Supp =%3d  Node =%5d) -> ", Cudd_SupportSize(p->dd, bTemp),        Cudd_DagSize(bTemp) );
        printf( "(Supp =%3d  Node =%5d)\n",   Cudd_SupportSize(p->dd, pPart->bFunc), Cudd_DagSize(pPart->bFunc) );

        RetValue = (Cudd_DagSize(bTemp) == Cudd_DagSize(pPart->bFunc));

        Cudd_RecursiveDeref( p->dd, bTemp );

        if ( RetValue )
            return 1;
    }
    else
    {
        // create cube to be quantified
        bCube = Llb_NonlinCreateCube1( p, pPart );   Cudd_Ref( bCube );
//        assert( !Cudd_IsConstant(bCube) );
        // derive new function
        pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_NonlinRemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && p->pVars2Q[i] )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_NonlinQuantify1( p, pTemp, 0 );
    Vec_PtrFree( vSingles );
    return 0;
}